

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_nv_equal(nghttp2_nv *a,nghttp2_nv *b)

{
  int iVar1;
  nghttp2_nv *b_local;
  nghttp2_nv *a_local;
  
  if ((a->namelen == b->namelen) && (a->valuelen == b->valuelen)) {
    if ((a->name == (uint8_t *)0x0) || (b->name == (uint8_t *)0x0)) {
      if (a->namelen != 0) {
        __assert_fail("a->namelen == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                      ,0x3d5,"int nghttp2_nv_equal(const nghttp2_nv *, const nghttp2_nv *)");
      }
      if (b->namelen != 0) {
        __assert_fail("b->namelen == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                      ,0x3d6,"int nghttp2_nv_equal(const nghttp2_nv *, const nghttp2_nv *)");
      }
    }
    else {
      iVar1 = memcmp(a->name,b->name,a->namelen);
      if (iVar1 != 0) {
        return 0;
      }
    }
    if ((a->value == (uint8_t *)0x0) || (b->value == (uint8_t *)0x0)) {
      if (a->valuelen != 0) {
        __assert_fail("a->valuelen == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                      ,0x3dc,"int nghttp2_nv_equal(const nghttp2_nv *, const nghttp2_nv *)");
      }
      if (b->valuelen != 0) {
        __assert_fail("b->valuelen == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                      ,0x3dd,"int nghttp2_nv_equal(const nghttp2_nv *, const nghttp2_nv *)");
      }
    }
    else {
      iVar1 = memcmp(a->value,b->value,a->valuelen);
      if (iVar1 != 0) {
        return 0;
      }
    }
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int nghttp2_nv_equal(const nghttp2_nv *a, const nghttp2_nv *b) {
  if (a->namelen != b->namelen || a->valuelen != b->valuelen) {
    return 0;
  }

  if (a->name == NULL || b->name == NULL) {
    assert(a->namelen == 0);
    assert(b->namelen == 0);
  } else if (memcmp(a->name, b->name, a->namelen) != 0) {
    return 0;
  }

  if (a->value == NULL || b->value == NULL) {
    assert(a->valuelen == 0);
    assert(b->valuelen == 0);
  } else if (memcmp(a->value, b->value, a->valuelen) != 0) {
    return 0;
  }

  return 1;
}